

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

st_ptls_key_schedule_t * key_schedule_new(ptls_hash_algorithm_t *algo)

{
  ptls_hash_context_t *__dest;
  st_ptls_key_schedule_t *local_80;
  long local_78;
  long local_28;
  ptls_hash_context_t *hash;
  st_ptls_key_schedule_t *sched;
  ptls_hash_algorithm_t *algo_local;
  
  hash = (ptls_hash_context_t *)0x0;
  local_28 = 0;
  sched = (st_ptls_key_schedule_t *)algo;
  hash = (ptls_hash_context_t *)malloc(0x58);
  if (hash == (ptls_hash_context_t *)0x0) {
    algo_local = (ptls_hash_algorithm_t *)0x0;
  }
  else {
    local_28 = (**(code **)&sched->generation)();
    __dest = hash;
    if (local_28 == 0) {
      free(hash);
      algo_local = (ptls_hash_algorithm_t *)0x0;
    }
    else {
      memset(&local_80,0,0x58);
      local_80 = sched;
      local_78 = local_28;
      memcpy(__dest,&local_80,0x58);
      algo_local = (ptls_hash_algorithm_t *)hash;
    }
  }
  return (st_ptls_key_schedule_t *)algo_local;
}

Assistant:

static struct st_ptls_key_schedule_t *key_schedule_new(ptls_hash_algorithm_t *algo)
{
    struct st_ptls_key_schedule_t *sched = NULL;
    ptls_hash_context_t *hash = NULL;

    if ((sched = malloc(sizeof(*sched))) == NULL)
        return NULL;
    if ((hash = algo->create()) == NULL) {
        free(sched);
        return NULL;
    }

    *sched = (struct st_ptls_key_schedule_t){algo, hash};
    return sched;
}